

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sqlite3.c
# Opt level: O0

void heightOfSelect(Select *pSelect,int *pnHeight)

{
  Select *local_20;
  Select *p;
  int *pnHeight_local;
  Select *pSelect_local;
  
  for (local_20 = pSelect; local_20 != (Select *)0x0; local_20 = local_20->pPrior) {
    heightOfExpr(local_20->pWhere,pnHeight);
    heightOfExpr(local_20->pHaving,pnHeight);
    heightOfExpr(local_20->pLimit,pnHeight);
    heightOfExprList(local_20->pEList,pnHeight);
    heightOfExprList(local_20->pGroupBy,pnHeight);
    heightOfExprList(local_20->pOrderBy,pnHeight);
  }
  return;
}

Assistant:

static void heightOfSelect(Select *pSelect, int *pnHeight){
  Select *p;
  for(p=pSelect; p; p=p->pPrior){
    heightOfExpr(p->pWhere, pnHeight);
    heightOfExpr(p->pHaving, pnHeight);
    heightOfExpr(p->pLimit, pnHeight);
    heightOfExprList(p->pEList, pnHeight);
    heightOfExprList(p->pGroupBy, pnHeight);
    heightOfExprList(p->pOrderBy, pnHeight);
  }
}